

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

uint firstbits_b_min(uint a,uint lo,uint hi,uint min_separation)

{
  undefined4 local_1c;
  uint b_min;
  uint min_separation_local;
  uint hi_local;
  uint lo_local;
  uint a_local;
  
  local_1c = ((lo * 2 * lo + a) - 1) / a;
  if (local_1c < a + min_separation) {
    local_1c = a + min_separation;
  }
  if (hi < local_1c) {
    local_1c = hi;
  }
  return local_1c;
}

Assistant:

static inline unsigned firstbits_b_min(
    unsigned a, unsigned lo, unsigned hi, unsigned min_separation)
{
    /* To get a large enough product, b must be at least this much */
    unsigned b_min = (2*lo*lo + a - 1) / a;
    /* Now enforce a<b, optionally with minimum separation */
    if (b_min < a + min_separation)
        b_min = a + min_separation;
    /* And cap at the upper limit */
    if (b_min > hi)
        b_min = hi;
    return b_min;
}